

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_msg.c
# Opt level: O2

_Bool uo_http_req_set_request_line
                (uo_http_req *http_req,uo_http_method method,char *uri,uo_http_ver version)

{
  uint uVar1;
  uint uVar2;
  char *__dest;
  int iVar3;
  size_t __n;
  size_t __n_00;
  undefined *__src;
  long lVar4;
  _Bool _Var5;
  size_t __n_01;
  char *ptr;
  _func_void_void_ptr *finalizer;
  
  if (((uint)http_req->flags & 4) != 0) {
    uVar1 = method - UO_HTTP_GET;
    if (((uVar1 < 8) && (uVar2 = version - UO_HTTP_VER_1_0, uVar2 < 3)) && (*uri != '\0')) {
      __n = *(size_t *)(&DAT_00109188 + (ulong)uVar1 * 8);
      iVar3 = *(int *)(&DAT_001091c8 + (ulong)uVar1 * 4);
      __n_00 = *(size_t *)(&DAT_001093c8 + (ulong)uVar2 * 8);
      __src = (&PTR_anon_var_dwarf_2ce5_0010edb8)[uVar2];
      __n_01 = strlen(uri);
      ptr = (char *)malloc(__n_01 + __n + __n_00 + 5);
      uo_refstack_push(&http_req->refstack,ptr,finalizer);
      memcpy(ptr,&DAT_001091c8 + iVar3,__n);
      (http_req->field_5).field_0.method_sp_uri = ptr;
      __dest = ptr + __n + 1;
      __dest[-1] = ' ';
      memcpy(__dest,uri,__n_01);
      (http_req->field_5).field_0.uri = __dest;
      lVar4 = __n_01 + __n + 1;
      ptr[__n_01 + __n + 1] = '\0';
      memcpy(ptr + __n_01 + __n + 2,__src,__n_00);
      (http_req->field_5).field_0.version_crlf = ptr + __n_01 + __n + 2;
      (ptr + __n_00 + 1 + lVar4)[0] = '\r';
      (ptr + __n_00 + 1 + lVar4)[1] = '\n';
      ptr[__n_00 + 3 + lVar4] = '\0';
      http_req->ver = version;
      (http_req->field_5).field_0.method = method;
      *(byte *)&http_req->flags = *(byte *)&http_req->flags | 8;
      _Var5 = true;
    }
    else {
      _Var5 = false;
    }
    return _Var5;
  }
  __assert_fail("http_req->flags.role == UO_HTTP_MSG_ROLE_SEND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_http/src/uo_http_msg.c"
                ,0x80,
                "_Bool uo_http_req_set_request_line(uo_http_req *, uo_http_method, const char *, uo_http_ver)"
               );
}

Assistant:

bool uo_http_req_set_request_line(
    uo_http_req *http_req,
    uo_http_method method,
    const char *uri,
    uo_http_ver version)
{
    assert(http_req->flags.role == UO_HTTP_MSG_ROLE_SEND);

    const char *method_str;
    size_t method_str_len;
    switch (method)
    {
        case UO_HTTP_GET:     method_str = "GET";     method_str_len = 3; break;
        case UO_HTTP_HEAD:    method_str = "HEAD";    method_str_len = 4; break;
        case UO_HTTP_PUT:     method_str = "PUT";     method_str_len = 3; break;
        case UO_HTTP_DELETE:  method_str = "DELETE";  method_str_len = 6; break;
        case UO_HTTP_OPTIONS: method_str = "OPTIONS"; method_str_len = 7; break;
        case UO_HTTP_TRACE:   method_str = "TRACE";   method_str_len = 5; break;
        case UO_HTTP_POST:    method_str = "POST";    method_str_len = 4; break;
        case UO_HTTP_CONNECT: method_str = "CONNECT"; method_str_len = 7; break;
        default: return false;
    }

    const char *version_str;
    size_t version_str_len;
    switch (version)
    {
        case UO_HTTP_VER_1_0: version_str = "HTTP/1.0"; version_str_len = 8; break;
        case UO_HTTP_VER_1_1: version_str = "HTTP/1.1"; version_str_len = 8; break;
        case UO_HTTP_VER_2:   version_str = "HTTP/2";   version_str_len = 6; break;
        default: return false;
    }

    if (!*uri)
        return false;

    size_t uri_len = strlen(uri);

    char *p = malloc(method_str_len + uri_len + version_str_len + 5);
    uo_refstack_push(&http_req->refstack, p, free);

    http_req->method_sp_uri = memcpy(p, method_str, method_str_len);
    p += method_str_len;
    *p++ = ' ';

    http_req->uri = memcpy(p, uri, uri_len);
    p += uri_len;
    *p++ = '\0'; // replaced with ' ' before sending the message

    http_req->version_crlf = memcpy(p, version_str, version_str_len);
    p += version_str_len;
    *p++ = '\r';
    *p++ = '\n';
    *p++ = '\0';

    http_req->ver = version;
    http_req->method = method;

    return http_req->flags.start_line = true;
}